

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

void ExpReplay::multipredict
               (expreplay *param_1,single_learner *base,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  polyprediction *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  example *in_RDI;
  undefined8 in_R8;
  undefined7 unaff_retaddr;
  
  LEARNER::learner<char,_example>::multipredict
            ((learner<char,_example> *)CONCAT17(finalize_predictions,unaff_retaddr),in_RDI,in_RSI,
             in_RDX,in_RCX,SUB81((ulong)in_R8 >> 0x38,0));
  return;
}

Assistant:

void multipredict(expreplay&, LEARNER::single_learner& base, example& ec, size_t count, size_t step,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, count, step, pred, finalize_predictions);
}